

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall ethash_check_difficulty_check::test_method(ethash_check_difficulty_check *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  size_type __dnew;
  ethash_h256_t target;
  size_type __dnew_1;
  long *local_228;
  long local_220;
  long local_218 [2];
  undefined **local_208;
  ulong local_200;
  shared_count sStack_1f8;
  long **local_1f0;
  char **local_1e8;
  long *local_1e0;
  long *local_1d8 [2];
  char local_1c8 [40];
  long local_1a0;
  undefined1 local_198 [8];
  undefined8 local_190;
  shared_count sStack_188;
  undefined **local_180;
  undefined1 local_178;
  undefined8 *local_170;
  char *local_168;
  undefined **local_160;
  undefined1 local_158;
  undefined ***local_150;
  char *local_148;
  long *local_140;
  char **local_138;
  undefined **local_130;
  undefined1 local_128;
  undefined ***local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined ***local_40;
  ulong **local_38;
  
  builtin_strncpy(local_1c8 + 0x10,"2222222222222222",0x10);
  builtin_strncpy(local_1c8,"2222222222222222",0x10);
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xbd);
  local_198[0] = 1;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_0013d750;
  local_170 = &boost::unit_test::lazy_ostream::inst;
  local_168 = "\nexpected \"";
  local_228 = (long *)0x20;
  local_1e8 = (char **)local_1d8;
  local_1e8 = (char **)std::__cxx11::string::_M_create((ulong *)&local_1e8,(ulong)&local_228);
  local_1d8[0] = local_228;
  ((long **)local_1e8)[2] = (long *)0x3131313131313131;
  ((long **)local_1e8)[3] = (long *)0x3131313131313131;
  *local_1e8 = (char *)0x3131313131313131;
  ((long **)local_1e8)[1] = (long *)0x3131313131313131;
  local_1e0 = local_228;
  *(char *)((long)local_1e8 + (long)local_228) = '\0';
  local_38 = (ulong **)&local_138;
  local_150 = &local_50;
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_0013d8d0;
  local_40 = &local_180;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0013dfd0;
  local_148 = "\" to have the same or less difficulty than \"";
  local_1a0 = 0x20;
  local_228 = local_218;
  local_138 = local_1e8;
  local_228 = (long *)std::__cxx11::string::_M_create((ulong *)&local_228,(ulong)&local_1a0);
  local_218[0] = local_1a0;
  local_228[2] = 0x3232323232323232;
  local_228[3] = 0x3232323232323232;
  *(undefined4 *)local_228 = 0x32323232;
  builtin_strncpy((char *)((long)local_228 + 4),"2222",4);
  *(undefined4 *)(local_228 + 1) = 0x32323232;
  builtin_strncpy((char *)((long)local_228 + 0xc),"2222",4);
  local_220 = local_1a0;
  *(char *)((long)local_228 + local_1a0) = '\0';
  local_1f0 = &local_140;
  local_120 = &local_208;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = &PTR__lazy_ostream_0013e010;
  sStack_1f8.pi_ = (sp_counted_base *)&local_160;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013e050;
  local_118 = "\"\n";
  local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_78 = "";
  local_140 = local_228;
  boost::test_tools::tt_detail::report_assertion(local_198,&local_130,&local_80,0xbd,2,1,0);
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if ((long **)local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  boost::detail::shared_count::~shared_count(&sStack_188);
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0xbf);
  local_208._0_1_ = 1;
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013da10;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_b0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  builtin_strncpy(local_1c8,"11111111111111111111111111111112",0x20);
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0xc3);
  uVar4 = 0xffffffffffffffff;
  do {
    if (uVar4 == 0x1e) {
      local_208._0_1_ = true;
      goto LAB_0011dbcf;
    }
    lVar1 = uVar4 + 2;
    lVar2 = uVar4 + 2;
    uVar4 = uVar4 + 1;
  } while ("11111111111111111111111111111111"[lVar1] == local_1c8[lVar2]);
  local_208._0_1_ =
       (byte)"11111111111111111111111111111111"[lVar1] < (byte)local_1c8[lVar2] || 0x1e < uVar4;
LAB_0011dbcf:
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013da10;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_e0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  builtin_strncpy(local_1c8,"11111111111111111111111111111110",0x20);
  local_f0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,199);
  uVar4 = 0xffffffffffffffff;
  do {
    if (uVar4 == 0x1e) {
      bVar3 = false;
      goto LAB_0011dcaf;
    }
    lVar1 = uVar4 + 2;
    lVar2 = uVar4 + 2;
    uVar4 = uVar4 + 1;
  } while ("11111111111111111111111111111111"[lVar1] == local_1c8[lVar2]);
  bVar3 = (byte)local_1c8[lVar2] <= (byte)"11111111111111111111111111111111"[lVar1] && uVar4 < 0x1f;
LAB_0011dcaf:
  local_208 = (undefined **)CONCAT71(local_208._1_7_,bVar3);
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_128 = 0;
  local_130 = &PTR__lazy_ostream_0013da10;
  local_120 = (undefined ***)&boost::unit_test::lazy_ostream::inst;
  local_118 = "";
  local_110 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_108 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_check_difficulty_check) {
	ethash_h256_t hash;
	ethash_h256_t target;
	memcpy(&hash, "11111111111111111111111111111111", 32);
	memcpy(&target, "22222222222222222222222222222222", 32);
	BOOST_REQUIRE_MESSAGE(
			ethash_check_difficulty(&hash, &target),
			"\nexpected \"" << std::string((char *) &hash, 32).c_str() << "\" to have the same or less difficulty than \"" << std::string((char *) &target, 32).c_str() << "\"\n");
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &hash), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << hash << "\"\n");
	memcpy(&target, "11111111111111111111111111111112", 32);
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << target << "\"\n");
	memcpy(&target, "11111111111111111111111111111110", 32);
	BOOST_REQUIRE_MESSAGE(
			!ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have more difficulty than \"" << target << "\"\n");
}